

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void anon_unknown.dwarf_ae8::ndiIRCHKHelper(ndicapi *pol,char *command,char *commandReply)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = 1;
  if (command[5] == ' ') {
    cVar1 = command[6];
  }
  else {
    if (command[5] != ':') goto LAB_001087bd;
    cVar1 = command[10];
  }
  if (cVar1 != '\r') {
    uVar2 = ndiHexToUnsignedLong(command + 6,4);
  }
LAB_001087bd:
  if ((uVar2 & 1) != 0) {
    cVar1 = *commandReply;
    commandReply = commandReply + 1;
    pol->IrchkDetected = (int)cVar1;
  }
  if ((uVar2 & 2) != 0) {
    lVar3 = 0;
    do {
      if (commandReply[lVar3] < ' ') {
        return;
      }
      pol->IrchkSources[lVar3] = commandReply[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x7e);
  }
  return;
}

Assistant:

void ndiIRCHKHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    int j;

    // if the IRCHK command had a reply mode, read it
    if ((command[5] == ':' && command[10] != '\r') || (command[5] == ' ' && command[6] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[6], 4);
    }

    // a single character, '0' or '1'
    if (mode & NDI_DETECTED)
    {
      pol->IrchkDetected = *commandReply++;
    }

    // maximum string length for 20 sources is 2*(3 + 20*3) = 126
    // copy until a control char (less than 0x20) is found
    if (mode & NDI_SOURCES)
    {
      for (j = 0; j < 126 && *commandReply >= ' '; j++)
      {
        pol->IrchkSources[j] = *commandReply++;
      }
    }
  }